

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

float forcefloat(tagval *v)

{
  float local_1c;
  float f;
  tagval *v_local;
  
  local_1c = 0.0;
  switch(v->type) {
  case 1:
    local_1c = (float)(v->super_identval).field_0.i;
    break;
  case 2:
    return (float)(v->super_identval).field_0.i;
  case 3:
    local_1c = parsefloat((v->super_identval).field_0.s);
    break;
  case 6:
    local_1c = parsefloat((v->super_identval).field_0.s);
  }
  freearg(v);
  tagval::setfloat(v,local_1c);
  return local_1c;
}

Assistant:

static inline float forcefloat(tagval &v)
{
    float f = 0.0f;
    switch(v.type)
    {
        case VAL_INT: f = v.i; break;
        case VAL_STR: f = parsefloat(v.s); break;
        case VAL_MACRO: f = parsefloat(v.s); break;
        case VAL_FLOAT: return v.f;
    }
    freearg(v);
    v.setfloat(f);
    return f;
}